

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

Vec2 __thiscall
tcu::computeOpenGLLodBoundsFromDerivates
          (tcu *this,float dudx,float dvdx,float dwdx,float dudy,float dvdy,float dwdy,
          LodPrecision *prec)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  float fVar5;
  float value;
  float fVar6;
  undefined1 extraout_var [12];
  
  uVar1 = -(uint)(-dudx <= dudx);
  fVar3 = (float)(uVar1 & (uint)dudx | ~uVar1 & (uint)-dudx);
  uVar1 = -(uint)(-dudy <= dudy);
  fVar2 = (float)(uVar1 & (uint)dudy | ~uVar1 & (uint)-dudy);
  uVar1 = -(uint)(fVar2 <= fVar3);
  fVar2 = (float)(~uVar1 & (uint)fVar2 | uVar1 & (uint)fVar3);
  uVar1 = -(uint)(-dvdx <= dvdx);
  fVar6 = (float)(uVar1 & (uint)dvdx | ~uVar1 & (uint)-dvdx);
  uVar1 = -(uint)(-dvdy <= dvdy);
  fVar3 = (float)(uVar1 & (uint)dvdy | ~uVar1 & (uint)-dvdy);
  uVar1 = -(uint)(fVar3 <= fVar6);
  fVar5 = (float)(~uVar1 & (uint)fVar3 | uVar1 & (uint)fVar6);
  uVar1 = -(uint)(-dwdx <= dwdx);
  fVar6 = (float)(uVar1 & (uint)dwdx | ~uVar1 & (uint)-dwdx);
  uVar1 = -(uint)(-dwdy <= dwdy);
  fVar3 = (float)(uVar1 & (uint)dwdy | ~uVar1 & (uint)-dwdy);
  uVar1 = -(uint)(fVar3 <= fVar6);
  fVar6 = (float)(~uVar1 & (uint)fVar3 | uVar1 & (uint)fVar6);
  fVar3 = (float)(~-(uint)(fVar5 <= fVar2) & (uint)fVar5 | -(uint)(fVar5 <= fVar2) & (uint)fVar2);
  uVar1 = -(uint)(fVar6 <= fVar3);
  value = (float)(~uVar1 & (uint)fVar6 | uVar1 & (uint)fVar3);
  fVar6 = fVar5 + fVar2 + fVar6;
  fVar2 = TexVerifierUtil::computeFloatingPointError(value,prec->derivateBits);
  fVar3 = TexVerifierUtil::computeFloatingPointError(fVar6,prec->derivateBits);
  fVar2 = logf(value - fVar2);
  fVar3 = logf(fVar3 + fVar6);
  auVar4._0_4_ = TexVerifierUtil::computeFixedPointError(prec->lodBits);
  auVar4._4_12_ = extraout_var;
  *(float *)this = fVar2 * 1.442695 - auVar4._0_4_;
  *(float *)(this + 4) = fVar3 * 1.442695 + auVar4._0_4_;
  return (Vec2)auVar4._0_8_;
}

Assistant:

Vec2 computeOpenGLLodBoundsFromDerivates (const float dudx, const float dvdx, const float dwdx, const float dudy, const float dvdy, const float dwdy, const LodPrecision& prec)
{
	const float		mu			= de::max(deFloatAbs(dudx), deFloatAbs(dudy));
	const float		mv			= de::max(deFloatAbs(dvdx), deFloatAbs(dvdy));
	const float		mw			= de::max(deFloatAbs(dwdx), deFloatAbs(dwdy));
	const float		minDBound	= de::max(de::max(mu, mv), mw);
	const float		maxDBound	= mu + mv + mw;
	const float		minDErr		= computeFloatingPointError(minDBound, prec.derivateBits);
	const float		maxDErr		= computeFloatingPointError(maxDBound, prec.derivateBits);
	const float		minLod		= deFloatLog2(minDBound-minDErr);
	const float		maxLod		= deFloatLog2(maxDBound+maxDErr);
	const float		lodErr		= computeFixedPointError(prec.lodBits);

	DE_ASSERT(minLod <= maxLod);
	return Vec2(minLod-lodErr, maxLod+lodErr);
}